

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitruntime.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::JitRuntime::_add(JitRuntime *this,void **dst,CodeHolder *code)

{
  Error EVar1;
  anon_class_16_2_fe3bf45a *paVar2;
  anon_class_16_2_fe3bf45a *lambdaFunc;
  undefined8 *in_RSI;
  size_t codeSize;
  Error err;
  Error _err_2;
  Span span;
  size_t estimatedCodeSize;
  Error _err_1;
  Error _err;
  size_t in_stack_00000080;
  Span *in_stack_00000088;
  JitAllocator *in_stack_00000090;
  char *in_stack_00000360;
  int in_stack_0000036c;
  char *in_stack_00000370;
  JitAllocator in_stack_ffffffffffffff90;
  CodeHolder *in_stack_ffffffffffffffb0;
  Error local_1c;
  CodeHolder *in_stack_ffffffffffffffe8;
  
  *in_RSI = 0;
  local_1c = CodeHolder::flatten(in_stack_ffffffffffffffe8);
  if ((local_1c == 0) &&
     (local_1c = CodeHolder::resolveUnresolvedLinks((CodeHolder *)span._rx), local_1c == 0)) {
    paVar2 = (anon_class_16_2_fe3bf45a *)CodeHolder::codeSize(in_stack_ffffffffffffffb0);
    if (paVar2 == (anon_class_16_2_fe3bf45a *)0x0) {
      local_1c = DebugUtils::errored(10);
    }
    else {
      JitAllocator::Span::Span((Span *)&stack0xffffffffffffff90);
      local_1c = JitAllocator::alloc(in_stack_00000090,in_stack_00000088,in_stack_00000080);
      if (local_1c == 0) {
        EVar1 = CodeHolder::relocateToBase((CodeHolder *)dst,(uint64_t)code);
        if (EVar1 == 0) {
          lambdaFunc = (anon_class_16_2_fe3bf45a *)CodeHolder::codeSize(in_stack_ffffffffffffffb0);
          if (paVar2 < lambdaFunc) {
            DebugUtils::assertionFailed(in_stack_00000370,in_stack_0000036c,in_stack_00000360);
          }
          JitAllocator::
          write<asmjit::v1_14::JitRuntime::_add(void**,asmjit::v1_14::CodeHolder*)::__0>
                    ((JitAllocator *)in_stack_ffffffffffffff90._impl,
                     (Span *)CONCAT44(local_1c,EVar1),lambdaFunc,
                     (CachePolicy)((ulong)&stack0xffffffffffffff80 >> 0x20));
          *in_RSI = in_stack_ffffffffffffff90._impl;
          local_1c = 0;
        }
        else {
          JitAllocator::release((JitAllocator *)&stack0xffffffffffffff90,in_stack_ffffffffffffffe8);
          local_1c = EVar1;
        }
      }
    }
  }
  return local_1c;
}

Assistant:

Error JitRuntime::_add(void** dst, CodeHolder* code) noexcept {
  *dst = nullptr;

  ASMJIT_PROPAGATE(code->flatten());
  ASMJIT_PROPAGATE(code->resolveUnresolvedLinks());

  size_t estimatedCodeSize = code->codeSize();
  if (ASMJIT_UNLIKELY(estimatedCodeSize == 0))
    return DebugUtils::errored(kErrorNoCodeGenerated);

  JitAllocator::Span span;
  ASMJIT_PROPAGATE(_allocator.alloc(span, estimatedCodeSize));

  // Relocate the code.
  Error err = code->relocateToBase(uintptr_t(span.rx()));
  if (ASMJIT_UNLIKELY(err)) {
    _allocator.release(span.rx());
    return err;
  }

  // Recalculate the final code size and shrink the memory we allocated for it
  // in case that some relocations didn't require records in an address table.
  size_t codeSize = code->codeSize();
  ASMJIT_ASSERT(codeSize <= estimatedCodeSize);

  _allocator.write(span, [&](JitAllocator::Span& span) noexcept -> Error {
    uint8_t* rw = static_cast<uint8_t*>(span.rw());

    for (Section* section : code->_sections) {
      size_t offset = size_t(section->offset());
      size_t bufferSize = size_t(section->bufferSize());
      size_t virtualSize = size_t(section->virtualSize());

      ASMJIT_ASSERT(offset + bufferSize <= span.size());
      memcpy(rw + offset, section->data(), bufferSize);

      if (virtualSize > bufferSize) {
        ASMJIT_ASSERT(offset + virtualSize <= span.size());
        memset(rw + offset + bufferSize, 0, virtualSize - bufferSize);
      }
    }

    span.shrink(codeSize);
    return kErrorOk;
  });

  *dst = span.rx();
  return kErrorOk;
}